

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O0

int Extra_BitMatrixCountOnesUpper(Extra_BitMat_t *p)

{
  int local_1c;
  int local_18;
  int nTotal;
  int k;
  int i;
  Extra_BitMat_t *p_local;
  
  local_1c = 0;
  for (nTotal = 0; local_18 = nTotal, nTotal < p->nSize; nTotal = nTotal + 1) {
    while (local_18 = local_18 + 1, local_18 < p->nSize) {
      local_1c = (uint)((p->ppData[nTotal][local_18 >> 5] & 1 << ((byte)local_18 & 0x1f)) != 0) +
                 local_1c;
    }
  }
  return local_1c;
}

Assistant:

int Extra_BitMatrixCountOnesUpper( Extra_BitMat_t * p )
{
    int i, k, nTotal = 0;
    for ( i = 0; i < p->nSize; i++ )
        for ( k = i + 1; k < p->nSize; k++ )
            nTotal += ( (p->ppData[i][k>>5] & (1 << (k&31))) > 0 );
    return nTotal;
}